

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTPNStmCompBase::gen_code(CTPNStmCompBase *this,int param_2,int param_3)

{
  long lVar1;
  CTcTokFileDesc *desc;
  CTPNStmBase *in_RDI;
  CTcPrsSymtab *old_frame;
  CTPNStm *cur;
  CTcTokFileDesc *in_stack_ffffffffffffffb8;
  CTcTokenizer *this_00;
  CTPNStmBase *in_stack_ffffffffffffffc0;
  CTcTokenizer *in_stack_ffffffffffffffc8;
  CTcCodeStream *in_stack_ffffffffffffffd0;
  CTcTokFileDesc *local_18;
  
  CTcCodeStream::set_local_frame
            (in_stack_ffffffffffffffd0,(CTcPrsSymtab *)in_stack_ffffffffffffffc8);
  CTPNStmBase::add_debug_line_rec(in_stack_ffffffffffffffc0);
  for (local_18 = in_RDI[1].file_; local_18 != (CTcTokFileDesc *)0x0;
      local_18 = (CTcTokFileDesc *)CTPNStmBase::get_next_stm((CTPNStmBase *)local_18)) {
    in_stack_ffffffffffffffc8 = G_tok;
    in_stack_ffffffffffffffd0 =
         (CTcCodeStream *)CTPNStmBase::get_source_desc((CTPNStmBase *)local_18);
    lVar1 = CTPNStmBase::get_source_linenum((CTPNStmBase *)local_18);
    CTcTokenizer::set_line_info
              (in_stack_ffffffffffffffc8,(CTcTokFileDesc *)in_stack_ffffffffffffffd0,lVar1);
    (*(code *)**(undefined8 **)local_18)(local_18,1);
  }
  CTPNStmBase::add_debug_line_rec(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x26f181);
  if ((in_RDI[1].linenum_ != 0) &&
     (((ulong)in_RDI[2].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 1) != 0)) {
    this_00 = G_tok;
    desc = CTPNStmBase::get_source_desc(in_RDI);
    lVar1 = CTPNStmBase::get_source_linenum(in_RDI);
    CTcTokenizer::set_line_info(this_00,desc,lVar1);
  }
  CTcCodeStream::set_local_frame
            (in_stack_ffffffffffffffd0,(CTcPrsSymtab *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void CTPNStmCompBase::gen_code(int, int)
{
    CTPNStm *cur;
    CTcPrsSymtab *old_frame;

    /* set my local scope symbol frame, if necessary */
    old_frame = G_cs->set_local_frame(symtab_);

    /* set the code location for the start of the group */
    add_debug_line_rec();

    /* 
     *   iterate through our statements and generate code for each in
     *   sequence 
     */
    for (cur = first_stm_ ; cur != 0 ; cur = cur->get_next_stm())
    {
        /* 
         *   set this statement's source line location to be the current
         *   location for error reporting 
         */
        G_tok->set_line_info(cur->get_source_desc(),
                             cur->get_source_linenum());

        /* 
         *   Generate code for the statement.  Note that we generate in
         *   the scope of the enclosing symbol table, because we never
         *   resolve symbols to local scope during code generation - local
         *   scope symbols must be resolved during parsing, because these
         *   symbols must always be declared before first being used 
         *   
         *   We have no use for the results of any expressions, so discard
         *   = true; we don't care about the form of any logical operator
         *   results, so use the looser "for condition" rules 
         */
        cur->gen_code(TRUE, TRUE);
    }

    /* set the source location for the end of the group */
    add_debug_line_rec(end_desc_, end_linenum_);

    /* check for unreferenced local variables */
    if (symtab_ != 0 && has_own_scope_)
    {
        /* 
         *   set our line information to be current again, so that any
         *   unreferenced local errors are reported at the start of the
         *   compound statement 
         */
        G_tok->set_line_info(get_source_desc(),
                             get_source_linenum());
    }

    /* restore the enclosing local frame */
    old_frame = G_cs->set_local_frame(old_frame);
}